

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall cmCacheManager::CacheEntry::SetValue(CacheEntry *this,cmValue value)

{
  if (value.Value == (string *)0x0) {
    (this->Value)._M_string_length = 0;
    *(this->Value)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::_M_assign((string *)this);
    this->Initialized = true;
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetValue(cmValue value)
{
  if (value) {
    this->Value = *value;
    this->Initialized = true;
  } else {
    this->Value.clear();
  }
}